

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o1.cc
# Opt level: O3

bool lf::geometry::assertNonDegenerateTriangle(Matrix<double,__1,_3,_0,__1,_3> *coords,double tol)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PointerType pdVar2;
  Index rows;
  Index rows_00;
  Scalar SVar3;
  CoeffReturnType pdVar4;
  runtime_error *prVar5;
  PointerType pdVar6;
  long lVar7;
  long lVar8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  *pCVar9;
  undefined8 *puVar10;
  byte bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  Matrix<double,_3,_3,_0,_3,_3> c3d;
  stringstream ss;
  string local_2e0;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  Index local_2b0;
  string local_2a8;
  undefined8 local_288;
  undefined8 uStack_280;
  Index local_278;
  double local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_248;
  variable_if_dynamic<long,__1> local_238;
  variable_if_dynamic<long,__1> vStack_230;
  double local_228;
  PointerType local_220;
  variable_if_dynamic<long,__1> local_218;
  string local_1e0;
  double local_1c0;
  undefined1 local_1b8 [16];
  XprTypeNested local_1a8;
  long local_170;
  
  bVar11 = 0;
  rows = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_rows;
  local_270 = tol;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
          &local_2e0,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data
          + rows,rows,1);
  local_2c0 = 0;
  uStack_2b8 = 1;
  local_2b0 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.
              m_rows;
  local_2e0.field_2._8_8_ = coords;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
          &local_2a8,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data,
          local_2b0,1);
  local_288 = 0;
  uStack_280 = 0;
  local_278 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.
              m_rows;
  local_2a8.field_2._8_8_ = coords;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
                   *)local_258,(Lhs *)&local_2e0,(Rhs *)&local_2a8,
                  (scalar_difference_op<double,_double> *)local_1b8);
  pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
            *)local_258;
  puVar10 = (undefined8 *)(local_1b8 + 8);
  for (lVar7 = 0xe; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar10 = (pCVar9->m_lhs).
               super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>
               .m_data;
    pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
              *)((long)pCVar9 + (ulong)bVar11 * -0x10 + 8);
    puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
  }
  uVar12 = 0;
  uVar14 = 0;
  local_268._0_8_ = 0.0;
  if (local_170 != 0) {
    SVar3 = Eigen::
            DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>const,-1,1,true>const>const>>
            ::redux<Eigen::internal::scalar_sum_op<double,double>>
                      ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>const>const>>
                        *)local_1b8,(scalar_sum_op<double,_double> *)&local_1e0);
    uVar12 = SUB84(SVar3,0);
    uVar14 = (undefined4)((ulong)SVar3 >> 0x20);
  }
  rows_00 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.
            m_rows;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
          &local_2e0,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data
          + rows_00 * 2,rows_00,1);
  local_2c0 = 0;
  uStack_2b8 = 2;
  local_2b0 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.
              m_rows;
  local_2e0.field_2._8_8_ = coords;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
          &local_2a8,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data
          + local_2b0,local_2b0,1);
  local_288 = 0;
  uStack_280 = 1;
  local_278 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.
              m_rows;
  local_2a8.field_2._8_8_ = coords;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
                   *)local_258,(Lhs *)&local_2e0,(Rhs *)&local_2a8,
                  (scalar_difference_op<double,_double> *)local_1b8);
  pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
            *)local_258;
  puVar10 = (undefined8 *)(local_1b8 + 8);
  for (lVar7 = 0xe; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar10 = (pCVar9->m_lhs).
               super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>
               .m_data;
    pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
              *)((long)pCVar9 + (ulong)bVar11 * -0x10 + 8);
    puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
  }
  if (local_170 != 0) {
    local_268._0_8_ =
         Eigen::
         DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>const,-1,1,true>const>const>>
         ::redux<Eigen::internal::scalar_sum_op<double,double>>
                   ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>const>const>>
                     *)local_1b8,(scalar_sum_op<double,_double> *)&local_1e0);
  }
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
          &local_2e0,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_rows,
          1);
  local_2c0 = 0;
  uStack_2b8 = 0;
  local_2b0 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.
              m_rows;
  local_2e0.field_2._8_8_ = coords;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::
  MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
          &local_2a8,
          (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data
          + local_2b0 * 2,local_2b0,1);
  local_288 = 0;
  uStack_280 = 2;
  local_278 = (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.
              m_rows;
  local_2a8.field_2._8_8_ = coords;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
                   *)local_258,(Lhs *)&local_2e0,(Rhs *)&local_2a8,
                  (scalar_difference_op<double,_double> *)local_1b8);
  pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
            *)local_258;
  puVar10 = (undefined8 *)(local_1b8 + 8);
  for (lVar7 = 0xe; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar10 = (pCVar9->m_lhs).
               super_BlockImpl<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>
               .m_data;
    pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
              *)((long)pCVar9 + (ulong)bVar11 * -0x10 + 8);
    puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
  }
  if (local_170 == 0) {
    uVar13 = 0;
    uVar15 = 0;
  }
  else {
    SVar3 = Eigen::
            DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>const,-1,1,true>const>const>>
            ::redux<Eigen::internal::scalar_sum_op<double,double>>
                      ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>const>const>>
                        *)local_1b8,(scalar_sum_op<double,_double> *)&local_1e0);
    uVar13 = SUB84(SVar3,0);
    uVar15 = (undefined4)((ulong)SVar3 >> 0x20);
  }
  dVar16 = ((double)CONCAT44(uVar14,uVar12) + (double)local_268._0_8_ +
           (double)CONCAT44(uVar15,uVar13)) * local_270;
  if ((double)CONCAT44(uVar14,uVar12) <= dVar16) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Collapsed edge 0",0x10);
    local_258._0_8_ = local_258 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"e0lensq > tol * circum","")
    ;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_258,&local_2e0,0x14,&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_,aStack_248._M_allocated_capacity + 1);
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((double)local_268._0_8_ <= dVar16) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Collapsed edge 1",0x10);
    local_258._0_8_ = local_258 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"e1lensq > tol * circum","")
    ;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_258,&local_2e0,0x15,&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_,aStack_248._M_allocated_capacity + 1);
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (dVar16 <= (double)CONCAT44(uVar15,uVar13) && (double)CONCAT44(uVar15,uVar13) != dVar16) {
    local_270 = dVar16;
    if ((int)rows == 3) {
      Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_3,_3,_false>::Block
                ((Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,_3,_3,_false> *)local_1b8,
                 coords,0,0);
      lVar7 = (local_1a8->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.
              m_rows;
      pdVar6 = (PointerType)(local_1b8._0_8_ + 0x10);
      lVar8 = 0x10;
      do {
        dVar16 = pdVar6[-1];
        *(double *)(local_268 + lVar8) = pdVar6[-2];
        *(double *)(local_268 + lVar8 + 8) = dVar16;
        *(double *)(local_258 + lVar8) = *pdVar6;
        lVar8 = lVar8 + 0x18;
        pdVar6 = pdVar6 + lVar7;
      } while (lVar8 != 0x58);
      dVar17 = ((double)local_238.m_value - (double)local_258._8_8_) *
               ((double)local_218.m_value - (double)aStack_248._M_allocated_capacity) -
               ((double)local_220 - (double)local_258._8_8_) *
               ((double)vStack_230.m_value - (double)aStack_248._M_allocated_capacity);
      dVar18 = ((double)vStack_230.m_value - (double)aStack_248._M_allocated_capacity) *
               (local_228 - (double)local_258._0_8_) -
               ((double)local_218.m_value - (double)aStack_248._M_allocated_capacity) *
               ((double)aStack_248._8_8_ - (double)local_258._0_8_);
      dVar16 = ((double)aStack_248._8_8_ - (double)local_258._0_8_) *
               ((double)local_220 - (double)local_258._8_8_) -
               (local_228 - (double)local_258._0_8_) *
               ((double)local_238.m_value - (double)local_258._8_8_);
      if (SQRT(dVar16 * dVar16 + dVar18 * dVar18 + dVar17 * dVar17) <= local_270) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Degenerate 3D triangle",0x16);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e0,"area > tol * circum","");
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_2e0,&local_2a8,0x26,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if ((int)rows != 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Illegal world dimension",0x17);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        pdVar2 = (PointerType)(local_258 + 0x10);
        local_258._0_8_ = pdVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"false","");
        paVar1 = &local_2e0.field_2;
        local_2e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_258,&local_2e0,0x2b,&local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((PointerType)local_258._0_8_ != pdVar2) {
          operator_delete((void *)local_258._0_8_,aStack_248._M_allocated_capacity + 1);
        }
        local_258._0_8_ = pdVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"false","");
        local_2e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                   ,"");
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        base::AssertionFailed((string *)local_258,&local_2e0,0x2b,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)local_258);
        abort();
      }
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)coords,0,1);
      dVar16 = *pdVar4;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)coords,0,0);
      dVar17 = *pdVar4;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)coords,1,2);
      local_268._8_8_ = 0;
      local_268._0_8_ = *pdVar4;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)coords,1,0);
      uVar12 = local_268._12_4_;
      local_268._8_4_ = local_268._8_4_;
      local_268._0_8_ = (local_268._0_8_ - *pdVar4) * (dVar16 - dVar17);
      local_268._12_4_ = uVar12;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)coords,1,1);
      dVar16 = *pdVar4;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)coords,1,0);
      dVar17 = *pdVar4;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)coords,0,2);
      local_1c0 = *pdVar4;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_0> *)coords,0,0);
      if (ABS((double)local_268._0_8_ - (local_1c0 - *pdVar4) * (dVar16 - dVar17)) <= local_270) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Degenerate 2D triangle, geo = ",0x1e);
        Eigen::operator<<((ostream *)&local_1a8,
                          (DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)coords);
        local_258._0_8_ = local_258 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_258,"area > tol * circum","");
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_258,&local_2e0,0x1e,&local_2a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
          operator_delete((void *)local_258._0_8_,aStack_248._M_allocated_capacity + 1);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    return true;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Collapsed edge 2",0x10);
  local_258._0_8_ = local_258 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"e2lensq > tol * circum","");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o1.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed((string *)local_258,&local_2e0,0x16,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
    operator_delete((void *)local_258._0_8_,aStack_248._M_allocated_capacity + 1);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"this code should not be reached");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool assertNonDegenerateTriangle(
    const Eigen::Matrix<double, Eigen::Dynamic, 3>& coords, double tol) {
  // World dimension
  const Geometry::dim_t wd = coords.rows();
  // Length tests
  const double e0lensq = (coords.col(1) - coords.col(0)).squaredNorm();
  const double e1lensq = (coords.col(2) - coords.col(1)).squaredNorm();
  const double e2lensq = (coords.col(0) - coords.col(2)).squaredNorm();
  // Test lengths of edges versus circumference.
  const double circum = e0lensq + e1lensq + e2lensq;
  LF_VERIFY_MSG(e0lensq > tol * circum, "Collapsed edge 0");
  LF_VERIFY_MSG(e1lensq > tol * circum, "Collapsed edge 1");
  LF_VERIFY_MSG(e2lensq > tol * circum, "Collapsed edge 2");
  // Area test
  switch (wd) {
    case 2: {
      const double area = std::fabs(
          ((coords(0, 1) - coords(0, 0)) * (coords(1, 2) - coords(1, 0)) -
           (coords(1, 1) - coords(1, 0)) * (coords(0, 2) - coords(0, 0))));
      LF_VERIFY_MSG(area > tol * circum,
                    "Degenerate 2D triangle, geo = " << coords);
      return true;
      break;
    }
    case 3: {
      const Eigen::Matrix<double, 3, 3> c3d(coords.block<3, 3>(0, 0));
      const double area =
          ((c3d.col(1) - c3d.col(0)).cross(c3d.col(2) - c3d.col(0))).norm();
      LF_VERIFY_MSG(area > tol * circum, "Degenerate 3D triangle");
      return true;
      break;
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal world dimension" << wd);
      break;
    }
  }
  return false;
}